

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::CombinedUniformLimitCase::iterate
          (CombinedUniformLimitCase *this)

{
  GLenum GVar1;
  bool bVar2;
  int iVar3;
  deBool dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  int *piVar8;
  Enum<int,_2UL> EVar9;
  allocator<char> local_571;
  string local_570;
  allocator<char> local_549;
  string local_548;
  ScopedLogSection local_528;
  ScopedLogSection section;
  int limit;
  GetNameFunc local_508;
  int local_500;
  string local_4f8;
  allocator<char> local_4d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  GLenum local_450;
  undefined1 local_44c [4];
  deUint32 err_2;
  StateQueryMemoryWriteGuard<int> maxUniformComponents;
  GetNameFunc local_430;
  int local_428;
  string local_420;
  allocator<char> local_3f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  GLenum local_378;
  undefined1 local_374 [4];
  deUint32 err_1;
  StateQueryMemoryWriteGuard<int> maxUniformBlockSize;
  GetNameFunc local_358;
  int local_350;
  string local_348;
  allocator<char> local_321;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  GLenum local_2a0;
  undefined1 local_29c [4];
  deUint32 err;
  StateQueryMemoryWriteGuard<int> maxUniformBlocks;
  Enum<int,_2UL> local_280;
  GetNameFunc local_270;
  int local_268;
  Enum<int,_2UL> local_260;
  GetNameFunc local_250;
  int local_248;
  Enum<int,_2UL> local_240;
  MessageBuilder local_230;
  allocator<char> local_99;
  string local_98;
  undefined1 local_78 [8];
  ResultCollector result;
  CallLogWrapper gl;
  CombinedUniformLimitCase *this_local;
  
  checkTessellationSupport((this->super_TestCase).m_context);
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             (Functions *)CONCAT44(extraout_var,iVar3),pTVar6);
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98," // ERROR: ",&local_99);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_78,pTVar6,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)((long)&result.m_message.field_2 + 8),true);
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_230,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_230,(char (*) [22])"The minimum value of ");
  EVar9 = glu::getGettableStateStr(this->m_combined);
  local_250 = EVar9.m_getName;
  local_248 = EVar9.m_value;
  local_240.m_getName = local_250;
  local_240.m_value = local_248;
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_240);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [5])0x2b79bb1);
  EVar9 = glu::getGettableStateStr(this->m_numBlocks);
  local_270 = EVar9.m_getName;
  local_268 = EVar9.m_value;
  local_260.m_getName = local_270;
  local_260.m_value = local_268;
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_260);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [33])" x MAX_UNIFORM_BLOCK_SIZE / 4 + ")
  ;
  EVar9 = glu::getGettableStateStr(this->m_defaultComponents);
  maxUniformBlocks._4_8_ = EVar9.m_getName;
  local_280.m_value = EVar9.m_value;
  local_280.m_getName = (GetNameFunc)maxUniformBlocks._4_8_;
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_280);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_230);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int> *)local_29c);
  GVar1 = this->m_numBlocks;
  piVar8 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                     ((StateQueryMemoryWriteGuard<int> *)local_29c);
  glu::CallLogWrapper::glGetIntegerv
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),GVar1,piVar8);
  do {
    local_2a0 = glu::CallLogWrapper::glGetError
                          ((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
    if (local_2a0 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_320,"Got Error ",&local_321);
      EVar9 = glu::getErrorStr(local_2a0);
      maxUniformBlockSize._4_8_ = EVar9.m_getName;
      local_350 = EVar9.m_value;
      local_358 = (GetNameFunc)maxUniformBlockSize._4_8_;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_348,&local_358);
      std::operator+(&local_300,&local_320,&local_348);
      std::operator+(&local_2e0,&local_300,": ");
      std::operator+(&local_2c0,&local_2e0,"glGetIntegerv");
      tcu::ResultCollector::fail((ResultCollector *)local_78,&local_2c0);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_300);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::~string((string *)&local_320);
      std::allocator<char>::~allocator(&local_321);
    }
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int> *)local_374);
  piVar8 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                     ((StateQueryMemoryWriteGuard<int> *)local_374);
  glu::CallLogWrapper::glGetIntegerv
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0x8a30,piVar8);
  do {
    local_378 = glu::CallLogWrapper::glGetError
                          ((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
    if (local_378 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3f8,"Got Error ",&local_3f9);
      EVar9 = glu::getErrorStr(local_378);
      maxUniformComponents._4_8_ = EVar9.m_getName;
      local_428 = EVar9.m_value;
      local_430 = (GetNameFunc)maxUniformComponents._4_8_;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_420,&local_430);
      std::operator+(&local_3d8,&local_3f8,&local_420);
      std::operator+(&local_3b8,&local_3d8,": ");
      std::operator+(&local_398,&local_3b8,"glGetIntegerv");
      tcu::ResultCollector::fail((ResultCollector *)local_78,&local_398);
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::__cxx11::string::~string((string *)&local_420);
      std::__cxx11::string::~string((string *)&local_3f8);
      std::allocator<char>::~allocator(&local_3f9);
    }
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int> *)local_44c);
  GVar1 = this->m_defaultComponents;
  piVar8 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                     ((StateQueryMemoryWriteGuard<int> *)local_44c);
  glu::CallLogWrapper::glGetIntegerv
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),GVar1,piVar8);
  do {
    local_450 = glu::CallLogWrapper::glGetError
                          ((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
    if (local_450 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4d0,"Got Error ",&local_4d1);
      EVar9 = glu::getErrorStr(local_450);
      local_508 = EVar9.m_getName;
      local_500 = EVar9.m_value;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_4f8,&local_508);
      std::operator+(&local_4b0,&local_4d0,&local_4f8);
      std::operator+(&local_490,&local_4b0,": ");
      std::operator+(&local_470,&local_490,"glGetIntegerv");
      tcu::ResultCollector::fail((ResultCollector *)local_78,&local_470);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::string::~string((string *)&local_490);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::__cxx11::string::~string((string *)&local_4f8);
      std::__cxx11::string::~string((string *)&local_4d0);
      std::allocator<char>::~allocator(&local_4d1);
    }
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    ((StateQueryMemoryWriteGuard<int> *)local_29c,(ResultCollector *)local_78);
  if (((bVar2) &&
      (bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                         ((StateQueryMemoryWriteGuard<int> *)local_374,(ResultCollector *)local_78),
      bVar2)) &&
     (bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                        ((StateQueryMemoryWriteGuard<int> *)local_44c,(ResultCollector *)local_78),
     bVar2)) {
    piVar8 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                       ((StateQueryMemoryWriteGuard *)local_29c);
    iVar3 = *piVar8;
    piVar8 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                       ((StateQueryMemoryWriteGuard *)local_374);
    iVar3 = iVar3 * *piVar8;
    if (iVar3 < 0) {
      iVar3 = iVar3 + 3;
    }
    piVar8 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                       ((StateQueryMemoryWriteGuard *)local_44c);
    section.m_log._4_4_ = (iVar3 >> 2) + *piVar8;
    deqp::gls::StateQueryUtil::verifyStateIntegerMin
              ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               this->m_combined,section.m_log._4_4_,QUERY_INTEGER);
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_548,"Types",&local_549);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_570,"Alternative queries",&local_571);
    tcu::ScopedLogSection::ScopedLogSection(&local_528,pTVar6,&local_548,&local_570);
    std::__cxx11::string::~string((string *)&local_570);
    std::allocator<char>::~allocator(&local_571);
    std::__cxx11::string::~string((string *)&local_548);
    std::allocator<char>::~allocator(&local_549);
    deqp::gls::StateQueryUtil::verifyStateIntegerMin
              ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               this->m_combined,section.m_log._4_4_,QUERY_BOOLEAN);
    deqp::gls::StateQueryUtil::verifyStateIntegerMin
              ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               this->m_combined,section.m_log._4_4_,QUERY_INTEGER64);
    deqp::gls::StateQueryUtil::verifyStateIntegerMin
              ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               this->m_combined,section.m_log._4_4_,QUERY_FLOAT);
    tcu::ScopedLogSection::~ScopedLogSection(&local_528);
  }
  tcu::ResultCollector::setTestContextResult
            ((ResultCollector *)local_78,
             (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_78);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
  return STOP;
}

Assistant:

CombinedUniformLimitCase::IterateResult CombinedUniformLimitCase::iterate (void)
{
	checkTessellationSupport(m_context);

	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	m_testCtx.getLog()	<< tcu::TestLog::Message
						<< "The minimum value of " << glu::getGettableStateStr(m_combined)
						<< " is " << glu::getGettableStateStr(m_numBlocks)
						<< " x MAX_UNIFORM_BLOCK_SIZE / 4 + "
						<< glu::getGettableStateStr(m_defaultComponents)
						<< tcu::TestLog::EndMessage;

	StateQueryMemoryWriteGuard<glw::GLint> maxUniformBlocks;
	gl.glGetIntegerv(m_numBlocks, &maxUniformBlocks);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	StateQueryMemoryWriteGuard<glw::GLint> maxUniformBlockSize;
	gl.glGetIntegerv(GL_MAX_UNIFORM_BLOCK_SIZE, &maxUniformBlockSize);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	StateQueryMemoryWriteGuard<glw::GLint> maxUniformComponents;
	gl.glGetIntegerv(m_defaultComponents, &maxUniformComponents);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	if (maxUniformBlocks.verifyValidity(result) && maxUniformBlockSize.verifyValidity(result) && maxUniformComponents.verifyValidity(result))
	{
		const int limit = ((int)maxUniformBlocks) * ((int)maxUniformBlockSize) / 4 + (int)maxUniformComponents;
		verifyStateIntegerMin(result, gl, m_combined, limit, QUERY_INTEGER);

		{
			const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Types", "Alternative queries");
			verifyStateIntegerMin(result, gl, m_combined, limit, QUERY_BOOLEAN);
			verifyStateIntegerMin(result, gl, m_combined, limit, QUERY_INTEGER64);
			verifyStateIntegerMin(result, gl, m_combined, limit, QUERY_FLOAT);
		}
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}